

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  int commit_internal;
  int rc;
  int i;
  char **pzErrMsg_local;
  sqlite3 *db_local;
  
  uVar1 = db->mDbFlags;
  db->enc = db->aDb->pSchema->enc;
  if (((db->aDb->pSchema->schemaFlags & 1) == 1) ||
     (db_local._4_4_ = sqlite3InitOne(db,0,pzErrMsg,0), db_local._4_4_ == 0)) {
    commit_internal = db->nDb;
    do {
      commit_internal = commit_internal + -1;
      if (commit_internal < 1) {
        if ((uVar1 & 1) == 0) {
          sqlite3CommitInternalChanges(db);
        }
        return 0;
      }
    } while ((((db->aDb[commit_internal].pSchema)->schemaFlags & 1) == 1) ||
            (db_local._4_4_ = sqlite3InitOne(db,commit_internal,pzErrMsg,0), db_local._4_4_ == 0));
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->mDbFlags&DBFLAG_SchemaChange);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  ENC(db) = SCHEMA_ENC(db);
  assert( db->nDb>0 );
  /* Do the main schema first */
  if( !DbHasProperty(db, 0, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 0, pzErrMsg, 0);
    if( rc ) return rc;
  }
  /* All other schemas after the main schema. The "temp" schema must be last */
  for(i=db->nDb-1; i>0; i--){
    assert( i==1 || sqlite3BtreeHoldsMutex(db->aDb[i].pBt) );
    if( !DbHasProperty(db, i, DB_SchemaLoaded) ){
      rc = sqlite3InitOne(db, i, pzErrMsg, 0);
      if( rc ) return rc;
    }
  }
  if( commit_internal ){
    sqlite3CommitInternalChanges(db);
  }
  return SQLITE_OK;
}